

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_array_global.cpp
# Opt level: O0

void __thiscall
optimization::func_array_global::Func_Array_Global::optimize_func
          (Func_Array_Global *this,MirFunction *func,MirPackage *mir)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer ppVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  pointer pIVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  MirPackage *in_RDX;
  long in_RSI;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar9;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_8;
  iterator __end3_4;
  iterator __begin3_4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3_4;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_7;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3_3;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr_1;
  CallInst *callInst;
  Inst *i_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_6;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> ptr;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_5;
  iterator iter;
  VarId init_var;
  string name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  VarId ref_var;
  value_type *inst_4;
  mapped_type def_point;
  Var_Replace vp_1;
  VarId var_3;
  iterator __end3_2;
  iterator __begin3_2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range3_2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_3;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3_1;
  BasicBlk *init_blk;
  MirFunction *init_func;
  bool after_call;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  call_insts;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  init_insts;
  GlobalVarManager gvm;
  VarId var_2;
  iterator __end5_1;
  iterator __begin5_1;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range5_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_2;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  pair<const_int,_mir::inst::BasicBlk> *blk;
  iterator __end2_2;
  iterator __begin2_2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2_2;
  VarId var_1;
  iterator __end6;
  iterator __begin6;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range6;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars_1;
  CallInst *call;
  Inst *i;
  VarId var;
  iterator __end5;
  iterator __begin5;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range5;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> ref_results;
  Var_Replace vp;
  BasicBlk *startBlk;
  Variable *in_stack_fffffffffffff628;
  iterator in_stack_fffffffffffff630;
  ConstValue *in_stack_fffffffffffff638;
  _Optional_payload_base<int> in_stack_fffffffffffff640;
  const_iterator in_stack_fffffffffffff648;
  mapped_type *in_stack_fffffffffffff650;
  Function *in_stack_fffffffffffff658;
  pointer in_stack_fffffffffffff660;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *in_stack_fffffffffffff668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff670;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff678;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  VarId *in_stack_fffffffffffff688;
  Timestamp *in_stack_fffffffffffff6b8;
  iterator in_stack_fffffffffffff6c0;
  Variable *in_stack_fffffffffffff6d0;
  GlobalVarManager *in_stack_fffffffffffff6d8;
  Severity *in_stack_fffffffffffff728;
  mapped_type *in_stack_fffffffffffff730;
  ConstValue *in_stack_fffffffffffff750;
  VarId *in_stack_fffffffffffff758;
  string *in_stack_fffffffffffff760;
  ostream *in_stack_fffffffffffff768;
  MirFunction *in_stack_fffffffffffff798;
  Var_Replace *in_stack_fffffffffffff7a0;
  undefined8 local_7e8;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_790;
  undefined1 *local_788;
  reference local_780;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_778;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_770;
  undefined1 *local_768;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_760;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_750;
  undefined1 local_748 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  undefined1 local_6f8 [16];
  type local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_6e0 [4];
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_6a0;
  undefined1 local_698 [16];
  GlobalVarManager local_688 [3];
  undefined1 local_670 [48];
  reference local_640;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_638;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_630;
  uint32_t local_624;
  Severity local_5e0 [15];
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string local_5a8 [120];
  time_point_sys_clock local_530;
  Timestamp local_528 [3];
  undefined1 local_4da;
  optional<int> local_4d8 [13];
  string local_470 [32];
  string local_450 [36];
  undefined4 local_42c;
  undefined1 local_410 [48];
  _Base_ptr local_3e0;
  VarId local_3d8;
  reference local_3c8;
  mapped_type local_3c0;
  _Self local_340;
  _Self local_338;
  undefined1 *local_330;
  reference local_328;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_320;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_318;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_310;
  _Base_ptr local_308;
  BasicBlk *local_300;
  MirFunction *local_2f8;
  byte local_2e9;
  undefined1 local_2e8 [24];
  undefined1 local_2d0 [24];
  GlobalVarManager local_2b8;
  undefined1 local_2b0 [64];
  _Self local_270;
  _Self local_268;
  undefined1 *local_260;
  reference local_258;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_250;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_248;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_240;
  reference local_238;
  _Self local_230;
  _Self local_228;
  long local_220;
  _Self local_208;
  _Self local_200;
  undefined1 *local_1f8;
  undefined1 local_1f0 [48];
  undefined8 local_1c0;
  type local_1b8;
  _Self local_1a0;
  _Self local_198;
  undefined1 *local_190;
  undefined1 local_188 [48];
  reference local_158;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_150;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_148;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_140;
  _Base_ptr local_138;
  undefined1 local_130;
  byte local_121;
  undefined1 local_120 [64];
  reference local_e0;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_d8;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_d0;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_c8;
  undefined1 local_c0 [152];
  _Base_ptr local_28;
  BasicBlk *local_20;
  MirPackage *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::size((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)0x1e91f0);
  if ((sVar3 != 0) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff630._M_current,(char *)in_stack_fffffffffffff628
                             ), !bVar1)) {
    local_28 = (_Base_ptr)
               std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        *)in_stack_fffffffffffff628);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1e923f);
    local_20 = &ppVar4->second;
    var_replace::Var_Replace::Var_Replace(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1e926d);
    local_c8 = &local_20->inst;
    local_d0._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffff628);
    local_d8 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffff628);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff630._M_current,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff628), bVar1) {
      local_e0 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_d0);
      pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1e92eb);
      local_121 = 0;
      iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
      bVar1 = false;
      if (iVar2 == 2) {
        pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1e932a);
        (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_120);
        local_121 = 1;
        sVar5 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)0x1e9355);
        bVar1 = sVar5 != 0;
      }
      if ((local_121 & 1) != 0) {
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1e938a);
      }
      if (bVar1) {
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1e93a4);
        pVar9 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffff650,
                         (value_type *)in_stack_fffffffffffff648._M_current);
        local_138 = (_Base_ptr)pVar9.first._M_node;
        local_130 = pVar9.second;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_d0);
    }
    local_140 = &local_20->inst;
    local_148._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffff628);
    local_150 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff628);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff630._M_current,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff628), bVar1) {
      local_158 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  ::operator*(&local_148);
      pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1e9494);
      iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 4) {
        pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1e94c6);
        (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_188);
        sVar5 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)0x1e94e9);
        if (1 < sVar5) {
          local_190 = local_188;
          local_198._M_node =
               (_Base_ptr)
               std::
               set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)in_stack_fffffffffffff628);
          local_1a0._M_node =
               (_Base_ptr)
               std::
               set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)in_stack_fffffffffffff628);
          while (bVar1 = std::operator!=(&local_198,&local_1a0), bVar1) {
            std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                      ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1e9558);
            ::mir::inst::VarId::VarId
                      ((VarId *)in_stack_fffffffffffff630._M_current,
                       (VarId *)in_stack_fffffffffffff628);
            sVar5 = std::
                    set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)in_stack_fffffffffffff640,(key_type *)in_stack_fffffffffffff638);
            if (sVar5 != 0) {
              std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::erase((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)in_stack_fffffffffffff630._M_current,(key_type *)in_stack_fffffffffffff628)
              ;
            }
            std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                      ((_Rb_tree_const_iterator<mir::inst::VarId> *)
                       in_stack_fffffffffffff630._M_current);
          }
        }
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1e95ff);
      }
      else {
        pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1e9611);
        iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 6) {
          local_1b8 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                      operator*(in_stack_fffffffffffff630._M_current);
          if (local_1b8 == (type)0x0) {
            local_7e8 = 0;
          }
          else {
            local_7e8 = __dynamic_cast(local_1b8,&::mir::inst::Inst::typeinfo,
                                       &::mir::inst::CallInst::typeinfo,0);
          }
          local_1c0 = local_7e8;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff630._M_current,
                                  (char *)in_stack_fffffffffffff628);
          if (!bVar1) {
            pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1e96f8);
            (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_1f0);
            sVar5 = std::
                    set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)0x1e971b);
            if (1 < sVar5) {
              local_1f8 = local_1f0;
              local_200._M_node =
                   (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_fffffffffffff628);
              local_208._M_node =
                   (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffff628);
              while (bVar1 = std::operator!=(&local_200,&local_208), bVar1) {
                std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                          ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1e978a);
                ::mir::inst::VarId::VarId
                          ((VarId *)in_stack_fffffffffffff630._M_current,
                           (VarId *)in_stack_fffffffffffff628);
                sVar5 = std::
                        set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 *)in_stack_fffffffffffff640,(key_type *)in_stack_fffffffffffff638);
                if (sVar5 != 0) {
                  std::
                  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::erase((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)in_stack_fffffffffffff630._M_current,
                          (key_type *)in_stack_fffffffffffff628);
                }
                std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                          ((_Rb_tree_const_iterator<mir::inst::VarId> *)
                           in_stack_fffffffffffff630._M_current);
              }
            }
            std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1e9831);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_148);
    }
    local_220 = local_10 + 0x68;
    local_228._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_fffffffffffff628);
    local_230._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffff628);
    while (bVar1 = std::operator!=(&local_228,&local_230), bVar1) {
      local_238 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                             0x1e98b0);
      if (local_238->first != local_20->id) {
        local_240 = &(local_238->second).inst;
        local_248._M_current =
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             std::
             vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffff628);
        local_250 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                    std::
                    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff628);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                   *)in_stack_fffffffffffff630._M_current,
                                  (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                   *)in_stack_fffffffffffff628), bVar1) {
          local_258 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      ::operator*(&local_248);
          pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              0x1e9956);
          iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
          if (iVar2 == 4) {
LAB_001e99a9:
            local_260 = local_c0;
            local_268._M_node =
                 (_Base_ptr)
                 std::
                 set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                 ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffff628);
            local_270._M_node =
                 (_Base_ptr)
                 std::
                 set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                 ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)in_stack_fffffffffffff628);
            while (bVar1 = std::operator!=(&local_268,&local_270), bVar1) {
              std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                        ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1e9a0e);
              ::mir::inst::VarId::VarId
                        ((VarId *)in_stack_fffffffffffff630._M_current,
                         (VarId *)in_stack_fffffffffffff628);
              pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                       operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)0x1e9a2b);
              (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_2b0);
              sVar5 = std::
                      set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                               *)in_stack_fffffffffffff640,(key_type *)in_stack_fffffffffffff638);
              std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)0x1e9a6d);
              if (sVar5 != 0) {
                std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::erase((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)in_stack_fffffffffffff630._M_current,
                        (key_type *)in_stack_fffffffffffff628);
                break;
              }
              std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                        ((_Rb_tree_const_iterator<mir::inst::VarId> *)
                         in_stack_fffffffffffff630._M_current);
            }
          }
          else {
            pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1e9984);
            iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
            if (iVar2 == 6) goto LAB_001e99a9;
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
          ::operator++(&local_248);
        }
      }
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 in_stack_fffffffffffff630._M_current);
    }
    sVar5 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1e9b05);
    if (sVar5 != 0) {
      GlobalVarManager::GlobalVarManager(&local_2b8,local_18);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)0x1e9b33);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)0x1e9b40);
      local_2e9 = 0;
      local_2f8 = GlobalVarManager::get_init_func((GlobalVarManager *)in_stack_fffffffffffff670);
      local_308 = (_Base_ptr)
                  std::
                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                           *)in_stack_fffffffffffff628);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1e9b95)
      ;
      local_300 = &ppVar4->second;
      local_310 = &(ppVar4->second).inst;
      local_318._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_fffffffffffff628);
      local_320 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffff628);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff630._M_current,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff628), bVar1) {
        local_328 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    ::operator*(&local_318);
        pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1e9c1f);
        iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 6) {
          local_2e9 = 1;
        }
        if ((local_2e9 & 1) == 0) {
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff630._M_current,
                      (value_type *)in_stack_fffffffffffff628);
        }
        else {
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff630._M_current,
                      (value_type *)in_stack_fffffffffffff628);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_318);
      }
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               *)0x1e9cc4);
      local_330 = local_c0;
      local_338._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffff628);
      local_340._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffff628);
      while (bVar1 = std::operator!=(&local_338,&local_340), bVar1) {
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1e9d29);
        ::mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff630._M_current,(VarId *)in_stack_fffffffffffff628)
        ;
        var_replace::Var_Replace::Var_Replace(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        pmVar6 = std::
                 map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                 ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                       *)in_stack_fffffffffffff650,(key_type *)in_stack_fffffffffffff648._M_current)
        ;
        local_3c0 = *pmVar6;
        std::
        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
        ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_fffffffffffff650,(key_type *)in_stack_fffffffffffff648._M_current);
        local_3c8 = std::
                    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff630._M_current,
                         (size_type)in_stack_fffffffffffff628);
        pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1e9de5);
        (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_410);
        local_3e0 = (_Base_ptr)
                    std::
                    set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)in_stack_fffffffffffff628);
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1e9e25);
        ::mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff630._M_current,(VarId *)in_stack_fffffffffffff628)
        ;
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1e9e42);
        std::
        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)in_stack_fffffffffffff650,(key_type_conflict *)in_stack_fffffffffffff648._M_current)
        ;
        iVar2 = ::mir::inst::Variable::size((Variable *)in_stack_fffffffffffff630._M_current);
        if (iVar2 < 0) {
          iVar2 = iVar2 + 3;
        }
        in_stack_fffffffffffff7a0 = (Var_Replace *)(long)(iVar2 >> 2);
        local_42c = 0;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1e9eb9);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff650,
                   (size_type)in_stack_fffffffffffff648._M_current,
                   (value_type *)in_stack_fffffffffffff640,
                   (allocator_type *)in_stack_fffffffffffff638);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e9eed);
        std::__cxx11::string::string(local_470,(string *)(local_10 + 8));
        ::mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffff630._M_current,(VarId *)in_stack_fffffffffffff628)
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                   in_stack_fffffffffffff678);
        std::optional<int>::optional(local_4d8);
        arm::ConstValue::ConstValue
                  (in_stack_fffffffffffff638,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffff630._M_current,(optional<int>)in_stack_fffffffffffff640);
        GlobalVarManager::add_global_var
                  ((GlobalVarManager *)in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                   in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        arm::ConstValue::~ConstValue((ConstValue *)0x1e9f9c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff640)
        ;
        std::__cxx11::string::~string(local_470);
        local_4da = 0;
        in_stack_fffffffffffff798 =
             (MirFunction *)
             AixLog::operator<<((ostream *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
        AixLog::Tag::Tag((Tag *)0x1e9fe9);
        AixLog::operator<<((ostream *)in_stack_fffffffffffff660,(Tag *)in_stack_fffffffffffff658);
        local_530.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_528,&local_530);
        AixLog::operator<<((ostream *)in_stack_fffffffffffff6c0._M_current,in_stack_fffffffffffff6b8
                          );
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff670,in_stack_fffffffffffff668->_M_local_buf,
                   (allocator<char> *)in_stack_fffffffffffff660);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff670,in_stack_fffffffffffff668->_M_local_buf,
                   (allocator<char> *)in_stack_fffffffffffff660);
        AixLog::Function::Function
                  ((Function *)in_stack_fffffffffffff640,(string *)in_stack_fffffffffffff638,
                   (string *)in_stack_fffffffffffff630._M_current,(size_t)in_stack_fffffffffffff628)
        ;
        poVar8 = AixLog::operator<<((ostream *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
        in_stack_fffffffffffff768 = std::operator<<(poVar8,"convert array ");
        in_stack_fffffffffffff760 =
             (string *)
             prelude::operator<<((ostream *)in_stack_fffffffffffff630._M_current,
                                 &in_stack_fffffffffffff628->super_Displayable);
        in_stack_fffffffffffff758 =
             (VarId *)std::operator<<((ostream *)in_stack_fffffffffffff760,"in ");
        in_stack_fffffffffffff750 =
             (ConstValue *)
             std::operator<<((ostream *)in_stack_fffffffffffff758,(string *)(local_10 + 8));
        poVar8 = std::operator<<((ostream *)in_stack_fffffffffffff750," to global array ");
        poVar8 = std::operator<<(poVar8,local_450);
        poVar8 = std::operator<<(poVar8,"");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        AixLog::Function::~Function((Function *)in_stack_fffffffffffff630._M_current);
        std::__cxx11::string::~string(local_5d0);
        std::allocator<char>::~allocator(&local_5d1);
        std::__cxx11::string::~string(local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
        AixLog::Timestamp::~Timestamp(local_528);
        AixLog::Tag::~Tag((Tag *)0x1ea240);
        std::make_unique<mir::inst::RefInst,mir::inst::VarId&,std::__cxx11::string&>
                  (in_stack_fffffffffffff688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
        in_stack_fffffffffffff728 = local_5e0;
        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::operator=
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   in_stack_fffffffffffff640,
                   (unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   in_stack_fffffffffffff638);
        std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   in_stack_fffffffffffff630._M_current);
        in_stack_fffffffffffff730 =
             std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   *)in_stack_fffffffffffff650,
                  (key_type_conflict *)in_stack_fffffffffffff648._M_current);
        ::mir::inst::Variable::Variable
                  ((Variable *)in_stack_fffffffffffff630._M_current,in_stack_fffffffffffff628);
        GlobalVarManager::get_new_init_id(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        ::mir::inst::Variable::~Variable((Variable *)0x1ea2f5);
        std::make_unique<mir::inst::RefInst,mir::inst::VarId&,std::__cxx11::string&>
                  (in_stack_fffffffffffff688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
        std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
        unique_ptr<mir::inst::RefInst,std::default_delete<mir::inst::RefInst>,void>
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   in_stack_fffffffffffff640,
                   (unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   in_stack_fffffffffffff638);
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)in_stack_fffffffffffff630._M_current,(value_type *)in_stack_fffffffffffff628)
        ;
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   in_stack_fffffffffffff640);
        std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   in_stack_fffffffffffff630._M_current);
        local_624 = ::mir::inst::VarId::operator_cast_to_unsigned_int(&local_3d8);
        std::
        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::erase((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)in_stack_fffffffffffff630._M_current,
                (key_type_conflict *)in_stack_fffffffffffff628);
        local_630._M_current =
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             std::
             vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffff628);
        while( true ) {
          local_638 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             *)in_stack_fffffffffffff628);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                              *)in_stack_fffffffffffff630._M_current,
                             (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                              *)in_stack_fffffffffffff628);
          if (!bVar1) break;
          local_640 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                      ::operator*(&local_630);
          pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              0x1ea423);
          (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_670);
          sVar5 = std::
                  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)in_stack_fffffffffffff640,(key_type *)in_stack_fffffffffffff638);
          bVar1 = false;
          if (sVar5 != 0) {
            pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1ea47c);
            iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
            bVar1 = iVar2 == 4;
          }
          std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1ea4c0);
          if (bVar1) {
            pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1ea4dd);
            (*(pIVar7->super_Displayable)._vptr_Displayable[6])();
            std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
            unique_ptr<std::default_delete<mir::inst::Inst>,void>
                      (in_stack_fffffffffffff630._M_current,(pointer)in_stack_fffffffffffff628);
            in_stack_fffffffffffff6d0 =
                 (Variable *)
                 std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x1ea51d);
            in_stack_fffffffffffff6d8 = local_688;
            ::mir::inst::VarId::VarId
                      ((VarId *)in_stack_fffffffffffff630._M_current,
                       (VarId *)in_stack_fffffffffffff628);
            ::mir::inst::VarId::VarId
                      ((VarId *)in_stack_fffffffffffff630._M_current,
                       (VarId *)in_stack_fffffffffffff628);
            (*(in_stack_fffffffffffff6d0->super_Displayable)._vptr_Displayable[3])
                      (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6d8,local_698);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffff630._M_current,
                        (value_type *)in_stack_fffffffffffff628);
            in_stack_fffffffffffff6b8 = (Timestamp *)&local_20->inst;
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
            ::
            __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                      ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_fffffffffffff630._M_current,
                       (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_fffffffffffff628);
            in_stack_fffffffffffff6c0 =
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffff640,in_stack_fffffffffffff648);
            local_6a0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        in_stack_fffffffffffff6c0;
            local_630._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff6c0;
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                      ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       in_stack_fffffffffffff640);
          }
          else {
            pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1ea88a);
            (*(pIVar7->super_Displayable)._vptr_Displayable[2])(local_6e0[0]._M_local_buf + 8);
            sVar5 = std::
                    set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             *)in_stack_fffffffffffff640,(key_type *)in_stack_fffffffffffff638);
            bVar1 = false;
            if (sVar5 != 0) {
              pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                       operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)0x1ea8e3);
              iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[1])();
              bVar1 = iVar2 == 6;
            }
            std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1ea924);
            if (bVar1) {
              local_6e0[0]._0_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                   ::operator*(&local_630);
              local_6e8 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                          operator*(in_stack_fffffffffffff630._M_current);
              if (local_6e8 == (type)0x0) {
                in_stack_fffffffffffff688 = (VarId *)0x0;
              }
              else {
                in_stack_fffffffffffff688 =
                     (VarId *)__dynamic_cast(local_6e8,&::mir::inst::Inst::typeinfo,
                                             &::mir::inst::CallInst::typeinfo,0);
              }
              local_6f8._8_8_ = in_stack_fffffffffffff688;
              in_stack_fffffffffffff687 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff630._M_current,
                                   (char *)in_stack_fffffffffffff628);
              if ((bool)in_stack_fffffffffffff687) {
                pIVar7 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                         operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                     *)0x1eaa11);
                iVar2 = (*(pIVar7->super_Displayable)._vptr_Displayable[6])();
                in_stack_fffffffffffff678 =
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(extraout_var,iVar2);
                in_stack_fffffffffffff658 = (Function *)local_6f8;
                std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                unique_ptr<std::default_delete<mir::inst::Inst>,void>
                          (in_stack_fffffffffffff630._M_current,(pointer)in_stack_fffffffffffff628);
                in_stack_fffffffffffff660 =
                     std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                     operator->((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)0x1eaa45);
                in_stack_fffffffffffff668 = &local_718.field_2;
                ::mir::inst::VarId::VarId
                          ((VarId *)in_stack_fffffffffffff630._M_current,
                           (VarId *)in_stack_fffffffffffff628);
                in_stack_fffffffffffff670 = &local_718;
                ::mir::inst::VarId::VarId
                          ((VarId *)in_stack_fffffffffffff630._M_current,
                           (VarId *)in_stack_fffffffffffff628);
                (*(in_stack_fffffffffffff660->super_Displayable)._vptr_Displayable[3])
                          (in_stack_fffffffffffff660,in_stack_fffffffffffff668,
                           in_stack_fffffffffffff670);
                in_stack_fffffffffffff648._M_current =
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     (local_10 + 0x38);
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           0x1eaab6);
                in_stack_fffffffffffff650 =
                     std::
                     map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                           *)in_stack_fffffffffffff650,
                          (key_type_conflict *)in_stack_fffffffffffff648._M_current);
                in_stack_fffffffffffff640 = (_Optional_payload_base<int>)local_748;
                ::mir::inst::Variable::Variable
                          ((Variable *)in_stack_fffffffffffff630._M_current,
                           in_stack_fffffffffffff628);
                GlobalVarManager::get_new_init_id
                          (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
                in_stack_fffffffffffff638 = (ConstValue *)local_6f8;
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           0x1eab13);
                ::mir::inst::VarId::operator=
                          ((VarId *)in_stack_fffffffffffff630._M_current,
                           (VarId *)in_stack_fffffffffffff628);
                ::mir::inst::Variable::~Variable((Variable *)0x1eab34);
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             *)in_stack_fffffffffffff630._M_current,
                            (value_type *)in_stack_fffffffffffff628);
                in_stack_fffffffffffff628 = (Variable *)&local_20->inst;
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
                ::
                __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                          ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            *)in_stack_fffffffffffff630._M_current,
                           (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            *)in_stack_fffffffffffff628);
                in_stack_fffffffffffff630 =
                     std::
                     vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)in_stack_fffffffffffff640,in_stack_fffffffffffff648);
                local_750 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            in_stack_fffffffffffff630;
                local_630._M_current =
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     in_stack_fffffffffffff630;
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           in_stack_fffffffffffff640);
              }
            }
            else {
              local_760 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          __gnu_cxx::
                          __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                        *)in_stack_fffffffffffff638,
                                       (int)((ulong)in_stack_fffffffffffff630._M_current >> 0x20));
            }
          }
        }
        std::__cxx11::string::~string(local_450);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff640)
        ;
        var_replace::Var_Replace::~Var_Replace((Var_Replace *)in_stack_fffffffffffff630._M_current);
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffff630._M_current
                  );
      }
      local_768 = local_2d0;
      local_770._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_fffffffffffff628);
      local_778 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffff628);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff630._M_current,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff628), bVar1) {
        local_780 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    ::operator*(&local_770);
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)in_stack_fffffffffffff630._M_current,(value_type *)in_stack_fffffffffffff628)
        ;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_770);
      }
      local_788 = local_2e8;
      local_790._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_fffffffffffff628);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)in_stack_fffffffffffff628);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff630._M_current,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff628), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator*(&local_790);
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)in_stack_fffffffffffff630._M_current,(value_type *)in_stack_fffffffffffff628)
        ;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_790);
      }
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 *)in_stack_fffffffffffff640);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 *)in_stack_fffffffffffff640);
    }
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1eaded);
    var_replace::Var_Replace::~Var_Replace((Var_Replace *)in_stack_fffffffffffff630._M_current);
  }
  return;
}

Assistant:

void Func_Array_Global::optimize_func(mir::inst::MirFunction& func,
                                      mir::inst::MirPackage& mir) {
  if (!func.basic_blks.size() || func.name == "$$5_main") {
    return;
  }
  auto& startBlk = func.basic_blks.begin()->second;
  var_replace::Var_Replace vp(func);
  std::set<mir::inst::VarId> ref_results;
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref &&
        inst->useVars().size()) {
      ref_results.insert(inst->dest);
    }
  }
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Store) {
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    } else if (inst->inst_kind() == mir::inst::InstKind::Call) {
      auto& i = *inst;
      auto call = dynamic_cast<mir::inst::CallInst*>(&i);
      if (call->func == "memset") {
        continue;
      }
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    }
  }

  for (auto& blk : func.basic_blks) {
    if (blk.first == startBlk.id) {
      continue;
    }
    for (auto& inst : blk.second.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Store ||
          inst->inst_kind() == mir::inst::InstKind::Call) {
        for (auto var : ref_results) {
          if (inst->useVars().count(var)) {
            ref_results.erase(var);
            break;
          }
        }
      }
    }
  }

  if (ref_results.size()) {
    GlobalVarManager gvm(mir);
    std::vector<std::unique_ptr<mir::inst::Inst>> init_insts;
    std::vector<std::unique_ptr<mir::inst::Inst>> call_insts;
    bool after_call = false;
    auto& init_func = gvm.get_init_func();
    auto& init_blk = init_func.basic_blks.begin()->second;
    for (auto& inst : init_blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Call) {
        after_call = true;
      }
      if (after_call) {
        call_insts.push_back(std::move(inst));
      } else {
        init_insts.push_back(std::move(inst));
      }
    }
    init_blk.inst.clear();
    for (auto var : ref_results) {
      var_replace::Var_Replace vp(func);
      auto def_point = vp.defpoint.at(var);
      auto& inst =
          func.basic_blks.at(def_point.first).inst.at(def_point.second);
      auto ref_var = *inst->useVars().begin();
      std::vector<uint32_t> val(func.variables.at(ref_var.id).size() / 4, 0);
      auto name = gvm.add_global_var(func.name, ref_var, val);
      LOG(TRACE) << "convert array " << ref_var << "in " << func.name
                 << " to global array " << name << "" << std::endl;
      inst = std::make_unique<mir::inst::RefInst>(var, name);
      auto init_var = gvm.get_new_init_id(func.variables.at(var.id));
      init_insts.push_back(
          std::make_unique<mir::inst::RefInst>(init_var, name));
      func.variables.erase(ref_var);

      for (auto iter = startBlk.inst.begin(); iter != startBlk.inst.end();) {
        auto& inst = *iter;
        if (inst->useVars().count(var) &&
            inst->inst_kind() == mir::inst::InstKind::Store) {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          ptr->replace(var, init_var);
          init_insts.push_back(std::move(ptr));
          iter = startBlk.inst.erase(iter);
        } else if (inst->useVars().count(var) &&
                   inst->inst_kind() == mir::inst::InstKind::Call) {
          auto& inst = *iter;
          auto& i = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          if (callInst->func == "memset") {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            ptr->replace(var, init_var);
            ptr->dest = gvm.get_new_init_id(func.variables.at(inst->dest.id));
            init_insts.push_back(std::move(ptr));
            iter = startBlk.inst.erase(iter);
          }
        } else {
          iter++;
        }
      }
    }

    for (auto& inst : init_insts) {
      init_blk.inst.push_back(std::move(inst));
    }

    for (auto& inst : call_insts) {
      init_blk.inst.push_back(std::move(inst));
    }
  }
}